

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  ulong uVar3;
  allocator<char> local_79;
  string local_78;
  undefined1 local_48 [8];
  string className;
  SectionNode *rootSection;
  TestCaseStats *stats;
  TestCaseNode *testCaseNode_local;
  JunitReporter *this_local;
  
  sVar2 = std::
          vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
          ::size(&testCaseNode->children);
  if (sVar2 != 1) {
    __assert_fail("testCaseNode.children.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/szborows[P]yebash/test/catch.hpp"
                  ,0x24d7,"void Catch::JunitReporter::writeTestCase(const TestCaseNode &)");
  }
  this_00 = std::
            vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ::front(&testCaseNode->children);
  className.field_2._8_8_ = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_00);
  std::__cxx11::string::string
            ((string *)local_48,(string *)&(testCaseNode->value).testInfo.className);
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) &&
     (bVar1 = std::
              vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
              ::empty((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                       *)(className.field_2._8_8_ + 0xa8)), bVar1)) {
    std::__cxx11::string::operator=((string *)local_48,"global");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
  writeSection(this,(string *)local_48,&local_78,(SectionNode *)className.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void writeTestCase( TestCaseNode const& testCaseNode ) {
            TestCaseStats const& stats = testCaseNode.value;

            // All test cases have exactly one section - which represents the
            // test case itself. That section may have 0-n nested sections
            assert( testCaseNode.children.size() == 1 );
            SectionNode const& rootSection = *testCaseNode.children.front();

            std::string className = stats.testInfo.className;

            if( className.empty() ) {
                if( rootSection.childSections.empty() )
                    className = "global";
            }
            writeSection( className, "", rootSection );
        }